

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

int cond(LexState *ls)

{
  expdesc v;
  expdesc local_48;
  
  local_48.usertype = (TString *)0x0;
  local_48.k = VVOID;
  local_48._4_4_ = 0;
  local_48.u.ival = 0;
  local_48.u.ind.usertype = (TString *)0x0;
  local_48.t = 0;
  local_48.f = 0;
  local_48.ravi_type_map = 0xffffffff;
  local_48._36_4_ = 0;
  local_48.pc = -1;
  local_48._52_4_ = 0;
  subexpr(ls,&local_48,0);
  if (local_48.k == VNIL) {
    local_48.k = VFALSE;
  }
  luaK_goiftrue(ls->fs,&local_48);
  return local_48.f;
}

Assistant:

static int cond (LexState *ls) {
  /* cond -> exp */
  expdesc v = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  expr(ls, &v);                   /* read condition */
  if (v.k == VNIL) v.k = VFALSE;  /* 'falses' are all equal here */
  luaK_goiftrue(ls->fs, &v);
  return v.f;
}